

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

Result __thiscall
wabt::BinaryReaderLogging::BeginGlobal
          (BinaryReaderLogging *this,Index index,Type type,bool mutable_)

{
  Stream *this_00;
  Enum EVar1;
  char *pcVar2;
  undefined7 in_register_00000009;
  char *pcVar3;
  
  WriteIndent(this);
  this_00 = this->stream_;
  pcVar2 = GetTypeName(type);
  pcVar3 = "false";
  if ((int)CONCAT71(in_register_00000009,mutable_) != 0) {
    pcVar3 = "true";
  }
  Stream::Writef(this_00,"BeginGlobal(index: %u, type: %s, mutable: %s)\n",(ulong)index,pcVar2,
                 pcVar3);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x24])
                    (this->reader_,(ulong)index,(ulong)(uint)type,
                     CONCAT71(in_register_00000009,mutable_) & 0xffffffff);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::BeginGlobal(Index index, Type type, bool mutable_) {
  LOGF("BeginGlobal(index: %" PRIindex ", type: %s, mutable: %s)\n", index,
       GetTypeName(type), mutable_ ? "true" : "false");
  return reader_->BeginGlobal(index, type, mutable_);
}